

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unzClose(unzFile file)

{
  unz64_s *s;
  unzFile file_local;
  
  if (file == (unzFile)0x0) {
    file_local._4_4_ = -0x66;
  }
  else {
    if (*(long *)((long)file + 0x140) != 0) {
      unzCloseCurrentFile(file);
    }
    (**(code **)((long)file + 0x28))
              (*(undefined8 *)((long)file + 0x38),*(undefined8 *)((long)file + 0x60));
    if (file != (unzFile)0x0) {
      free(file);
    }
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

extern int ZEXPORT unzClose(unzFile file)
{
    unz64_s* s;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;

    if (s->pfile_in_zip_read != NULL)
        unzCloseCurrentFile(file);

    ZCLOSE64(s->z_filefunc, s->filestream);
    TRYFREE(s);
    return UNZ_OK;
}